

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint32_t roaring_uint32_iterator_read(roaring_uint32_iterator_t *it,uint32_t *buf,uint32_t count)

{
  _Bool _Var1;
  undefined8 in_RAX;
  uint32_t uVar2;
  ulong uVar3;
  undefined2 uStack_38;
  uint16_t low16;
  uint32_t consumed;
  
  uVar2 = 0;
  if ((count != 0) && (uVar2 = 0, it->has_value != false)) {
    uVar2 = 0;
    _uStack_38 = in_RAX;
    while( true ) {
      _uStack_38 = CONCAT22((short)it->current_value,uStack_38);
      _Var1 = container_iterator_read_into_uint32
                        (it->container,it->typecode,&it->container_it,it->highbits,buf,count - uVar2
                         ,&consumed,&low16);
      uVar3 = (ulong)consumed;
      uVar2 = uVar2 + consumed;
      if (_Var1) break;
      it->container_index = it->container_index + 1;
      _Var1 = loadfirstvalue(it);
      it->has_value = _Var1;
      if (!_Var1) {
        return uVar2;
      }
      buf = buf + uVar3;
      if (count <= uVar2) {
        return uVar2;
      }
    }
    it->has_value = true;
    it->current_value = (uint)low16 | it->highbits;
  }
  return uVar2;
}

Assistant:

uint32_t roaring_uint32_iterator_read(roaring_uint32_iterator_t *it,
                                      uint32_t *buf, uint32_t count) {
    uint32_t ret = 0;
    while (it->has_value && ret < count) {
        uint32_t consumed;
        uint16_t low16 = (uint16_t)it->current_value;
        bool has_value = container_iterator_read_into_uint32(
            it->container, it->typecode, &it->container_it, it->highbits, buf,
            count - ret, &consumed, &low16);
        ret += consumed;
        buf += consumed;
        if (has_value) {
            it->has_value = true;
            it->current_value = it->highbits | low16;
            assert(ret == count);
            return ret;
        }
        it->container_index++;
        it->has_value = loadfirstvalue(it);
    }
    return ret;
}